

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O1

void duckdb_je_pages_unmark_guards(void *head,void *tail)

{
  ulong __len;
  
  __len = 0xffffffffffffffff;
  if (tail != (void *)0x0 && head != (void *)0x0) {
    __len = (long)tail + (0x1000 - (long)head);
  }
  if (0x4000 < __len || (tail == (void *)0x0 || head == (void *)0x0)) {
    if (head != (void *)0x0) {
      mprotect(head,0x1000,3);
    }
    if (tail == (void *)0x0) {
      return;
    }
    __len = 0x1000;
    head = tail;
  }
  mprotect(head,__len,3);
  return;
}

Assistant:

void
pages_unmark_guards(void *head, void *tail) {
	assert(head != NULL || tail != NULL);
	assert(head == NULL || tail == NULL ||
	    (uintptr_t)head < (uintptr_t)tail);
#ifdef JEMALLOC_HAVE_MPROTECT
	bool head_and_tail = (head != NULL) && (tail != NULL);
	size_t range = head_and_tail ?
	    (uintptr_t)tail - (uintptr_t)head + PAGE :
	    SIZE_T_MAX;
	/*
	 * The amount of work that the kernel does in mprotect depends on the
	 * range argument.  SC_LARGE_MINCLASS is an arbitrary threshold chosen
	 * to prevent kernel from doing too much work that would outweigh the
	 * savings of performing one less system call.
	 */
	bool ranged_mprotect = head_and_tail && range <= SC_LARGE_MINCLASS;
	if (ranged_mprotect) {
		mprotect(head, range, PROT_READ | PROT_WRITE);
	} else {
		if (head != NULL) {
			mprotect(head, PAGE, PROT_READ | PROT_WRITE);
		}
		if (tail != NULL) {
			mprotect(tail, PAGE, PROT_READ | PROT_WRITE);
		}
	}
#else
	if (head != NULL) {
		os_pages_commit(head, PAGE, true);
	}
	if (tail != NULL) {
		os_pages_commit(tail, PAGE, true);
	}
#endif
}